

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

void __thiscall
Divide<0,_1,_1>::Divide(Divide<0,_1,_1> *this,IntView<0> _x,IntView<1> _y,IntView<1> _z)

{
  IntView<0> *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  Propagator *in_RDI;
  undefined8 in_R8;
  undefined1 uStack0000000000000008;
  undefined1 uStack0000000000000009;
  undefined6 uStack000000000000000a;
  _func_int **in_stack_00000010;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  Propagator *p;
  
  p = in_RDI;
  Propagator::Propagator(in_RDI);
  Checker::Checker((Checker *)in_RDI);
  in_RDI->_vptr_Propagator = (_func_int **)&PTR__Divide_0031e9e0;
  in_RDI[1]._vptr_Propagator = (_func_int **)&DAT_0031ea48;
  in_RDI[1].prop_id = (int)in_RSI;
  in_RDI[1].priority = (int)((ulong)in_RSI >> 0x20);
  in_RDI[1].satisfied = (Tchar)(char)in_RDX;
  in_RDI[1].in_queue = (bool)(char)((ulong)in_RDX >> 8);
  *(int6 *)&in_RDI[1].field_0x12 = (int6)((ulong)in_RDX >> 0x10);
  in_RDI[2]._vptr_Propagator = (_func_int **)in_RCX;
  in_RDI[2].prop_id = (int)in_R8;
  in_RDI[2].priority = (int)((ulong)in_R8 >> 0x20);
  in_RDI[2].satisfied = (Tchar)uStack0000000000000008;
  in_RDI[2].in_queue = (bool)uStack0000000000000009;
  *(undefined6 *)&in_RDI[2].field_0x12 = uStack000000000000000a;
  in_RDI[3]._vptr_Propagator = in_stack_00000010;
  in_RDI->priority = 1;
  IntView<0>::attach(in_RCX,p,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  IntView<1>::attach((IntView<1> *)in_RCX,p,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  IntView<1>::attach((IntView<1> *)in_RCX,p,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

Divide(IntView<U> _x, IntView<V> _y, IntView<W> _z) : x(_x), y(_y), z(_z) {
		priority = 1;
		assert(x.getMin() >= 0 && y.getMin() >= 1 && z.getMin() >= 0);
		x.attach(this, 0, EVENT_LU);
		y.attach(this, 1, EVENT_LU);
		z.attach(this, 2, EVENT_LU);
	}